

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall Catch::JsonReporter::endListing(JsonReporter *this)

{
  if (this->m_startedListing == true) {
    std::deque<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>::pop_back
              (&(this->m_objectWriters).c);
    std::deque<Catch::JsonReporter::Writer,_std::allocator<Catch::JsonReporter::Writer>_>::pop_back
              (&(this->m_writers).c);
  }
  this->m_startedListing = false;
  return;
}

Assistant:

void JsonReporter::endListing() {
        if ( m_startedListing ) { endObject(); }
        m_startedListing = false;
    }